

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O1

RecyclableObject *
TTD::NSSnapObjects::DoObjectInflation_SnapPromiseAllResolveElementFunctionInfo
          (SnapObject *snpObject,InflateMap *inflator)

{
  BaseDictionary<unsigned_long,_void_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this;
  SnapPromiseCapabilityInfo *capabilityInfo;
  bool bVar1;
  ScriptContext *ctx;
  JavascriptPromiseCapability *capabilities;
  JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *wrapper;
  RecyclableObject *pRVar2;
  JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *local_40;
  TTDVar local_38;
  
  if (snpObject->SnapObjectTag == SnapPromiseAllResolveElementFunctionObject) {
    capabilityInfo = (SnapPromiseCapabilityInfo *)snpObject->AddtlSnapObjectInfo;
    ctx = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
    capabilities = NSSnapValues::InflatePromiseCapabilityInfo(capabilityInfo,ctx,inflator);
    local_38 = capabilityInfo[1].PromiseVar;
    this = &inflator->m_promiseDataMap;
    bVar1 = JsUtil::
            BaseDictionary<unsigned_long,_void_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::ContainsKey(this,(unsigned_long *)&local_38);
    if (!bVar1) {
      local_40 = Js::JavascriptLibrary::CreateRemainingElementsWrapper_TTD
                           ((ctx->super_ScriptContextBase).javascriptLibrary,ctx,
                            *(uint32 *)&capabilityInfo[1].ResolveVar);
      local_38 = capabilityInfo[1].PromiseVar;
      JsUtil::
      BaseDictionary<unsigned_long,void*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<unsigned_long,void*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                ((BaseDictionary<unsigned_long,void*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)this,(unsigned_long *)&local_38,&local_40);
    }
    local_38 = capabilityInfo[1].PromiseVar;
    wrapper = (JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *)
              JsUtil::
              BaseDictionary<unsigned_long,_void_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::Item(this,(unsigned_long *)&local_38);
    pRVar2 = InflateMap::LookupObject(inflator,(TTD_PTR_ID)capabilityInfo[1].RejectVar);
    pRVar2 = Js::JavascriptLibrary::CreatePromiseAllResolveElementFunction_TTD
                       ((ctx->super_ScriptContextBase).javascriptLibrary,capabilities,
                        (uint32)capabilityInfo[1].CapabilityId,wrapper,pRVar2,
                        SUB81(capabilityInfo[2].CapabilityId,0));
    return pRVar2;
  }
  TTDAbort_unrecoverable_error("Tag does not match.");
}

Assistant:

Js::RecyclableObject* DoObjectInflation_SnapPromiseAllResolveElementFunctionInfo(const SnapObject* snpObject, InflateMap* inflator)
        {
            const SnapPromiseAllResolveElementFunctionInfo* aInfo = SnapObjectGetAddtlInfoAs<SnapPromiseAllResolveElementFunctionInfo*, SnapObjectType::SnapPromiseAllResolveElementFunctionObject>(snpObject);
            Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);

            Js::JavascriptPromiseCapability* capabilities = InflatePromiseCapabilityInfo(&aInfo->Capabilities, ctx, inflator);

            if (!inflator->IsPromiseInfoDefined<Js::JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper>(aInfo->RemainingElementsWrapperId))
            {
                Js::JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper* remainingWrapper = ctx->GetLibrary()->CreateRemainingElementsWrapper_TTD(ctx, aInfo->RemainingElementsValue);
                inflator->AddInflatedPromiseInfo(aInfo->RemainingElementsWrapperId, remainingWrapper);
            }
            Js::JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper* wrapper = inflator->LookupInflatedPromiseInfo<Js::JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper>(aInfo->RemainingElementsWrapperId);

            Js::RecyclableObject* values = inflator->LookupObject(aInfo->Values);

            return ctx->GetLibrary()->CreatePromiseAllResolveElementFunction_TTD(capabilities, aInfo->Index, wrapper, values, aInfo->AlreadyCalled);
        }